

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

bool __thiscall
MODEL3D::three_dim_model::filter_paths
          (three_dim_model *this,Paths *primary_paths,Paths *secondary_paths)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  pointer pIVar4;
  reference pvVar5;
  reference b;
  iterator __x;
  const_iterator local_a8;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_a0;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_98;
  iterator main_it;
  iterator main_end;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_80;
  iterator holes_it;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  local_68;
  __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
  local_60;
  undefined1 local_58 [8];
  IntPoint check;
  iterator inner_it;
  iterator inner_it_end;
  iterator outer_it;
  iterator outer_it_end;
  Paths *secondary_paths_local;
  Paths *primary_paths_local;
  three_dim_model *this_local;
  
  outer_it = std::
             vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ::end(primary_paths);
  inner_it_end = std::
                 vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ::begin(primary_paths);
  while (bVar1 = __gnu_cxx::operator!=(&inner_it_end,&outer_it), bVar1) {
    inner_it = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::end(primary_paths);
    check.Y = (cInt)std::
                    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    ::begin(primary_paths);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                               *)&check.Y,&inner_it), bVar1) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                          *)&check.Y,&inner_it_end);
      if (bVar1) {
        ClipperLib::IntPoint::IntPoint((IntPoint *)local_58,0,0);
        pvVar3 = __gnu_cxx::
                 __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                 ::operator->((__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                               *)&check.Y);
        local_60._M_current =
             (IntPoint *)
             std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin(pvVar3)
        ;
        pIVar4 = __gnu_cxx::
                 __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                 ::operator->(&local_60);
        local_58 = (undefined1  [8])pIVar4->X;
        pvVar3 = __gnu_cxx::
                 __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                 ::operator->((__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                               *)&check.Y);
        local_68._M_current =
             (IntPoint *)
             std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::begin(pvVar3)
        ;
        pIVar4 = __gnu_cxx::
                 __normal_iterator<ClipperLib::IntPoint_*,_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>
                 ::operator->(&local_68);
        check.X = pIVar4->Y;
        pvVar5 = __gnu_cxx::
                 __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                 ::operator*(&inner_it_end);
        iVar2 = ClipperLib::PointInPolygon((IntPoint *)local_58,pvVar5);
        if (iVar2 == 1) {
          pvVar5 = __gnu_cxx::
                   __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                   ::operator*((__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                                *)&check.Y);
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(secondary_paths,pvVar5);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
      ::operator++((__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                    *)&check.Y,0);
    }
    holes_it._M_current =
         (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
         __gnu_cxx::
         __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
         ::operator++(&inner_it_end,0);
  }
  bVar1 = std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::empty(secondary_paths);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    local_80._M_current =
         (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
         std::
         vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
         ::begin(secondary_paths);
    while( true ) {
      main_end = std::
                 vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ::end(secondary_paths);
      bVar1 = __gnu_cxx::operator!=(&local_80,&main_end);
      if (!bVar1) break;
      main_it = std::
                vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ::end(primary_paths);
      local_98._M_current =
           (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
           std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::begin(primary_paths);
      while( true ) {
        local_a0._M_current =
             (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
             std::
             vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ::end(primary_paths);
        bVar1 = __gnu_cxx::operator!=(&local_98,&local_a0);
        if (!bVar1) break;
        pvVar5 = __gnu_cxx::
                 __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                 ::operator*(&local_80);
        b = __gnu_cxx::
            __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
            ::operator*(&local_98);
        bVar1 = clipper_path_is_equal(this,pvVar5,b);
        if (bVar1) {
          __gnu_cxx::
          __normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>const*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>
          ::
          __normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>*>
                    ((__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>const*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>
                      *)&local_a8,&local_98);
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::erase(primary_paths,local_a8);
          __x = std::
                vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ::end(primary_paths);
          local_98 = std::
                     prev<__gnu_cxx::__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>>
                               ((__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                                 )__x._M_current,1);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
        ::operator++(&local_98,0);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
      ::operator++(&local_80,0);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MODEL3D::three_dim_model::filter_paths(
ClipperLib::Paths &primary_paths,
ClipperLib::Paths &secondary_paths)
{
    auto outer_it_end = primary_paths.end();
    for ( auto outer_it = primary_paths.begin();
         outer_it != outer_it_end;
         outer_it++)
    {
        //compare against every other polygon
        auto inner_it_end = primary_paths.end();
        for ( auto inner_it = primary_paths.begin();
             inner_it != inner_it_end;
             inner_it++)
        {
            if(inner_it!=outer_it)
            {
                ClipperLib::IntPoint check;
                // Pick a point of the polygon
                check.X = inner_it->begin()->X;
                check.Y = inner_it->begin()->Y;
                if(ClipperLib::PointInPolygon(check, *outer_it)==1)
                    secondary_paths.push_back(*inner_it);
            }
        }
    }
    // remove the identified paths from the main vector
    if(!secondary_paths.empty())
    {
        for ( auto holes_it = secondary_paths.begin();
        holes_it != secondary_paths.end();
        holes_it++)
        {
            auto main_end = primary_paths.end();
            for ( auto main_it = primary_paths.begin(); main_it != primary_paths.end(); main_it++)
            {
                if(clipper_path_is_equal(*holes_it, *main_it))
                {
                    primary_paths.erase(main_it);
                    //break the loop as this shape was found
                    main_it = std::prev(primary_paths.end(),1);
                }
            }
        }
        return true;
    }
    return false;
}